

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

_Bool Curl_conn_data_pending(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  _Bool _Var2;
  Curl_cfilter **ppCVar3;
  
  ppCVar3 = data->conn->cfilter + sockindex;
  while( true ) {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((pCVar1->field_0x24 & 1) != 0) break;
    ppCVar3 = &pCVar1->next;
  }
  _Var2 = (*pCVar1->cft->has_data_pending)(pCVar1,data);
  return _Var2;
}

Assistant:

bool Curl_conn_data_pending(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  (void)data;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->has_data_pending(cf, data);
  }
  return FALSE;
}